

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O2

void opn2_setScaleModulators(OPN2_MIDIPlayer *device,int smod)

{
  void *pvVar1;
  
  if (device != (OPN2_MIDIPlayer *)0x0) {
    pvVar1 = device->opn2_midiPlayer;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x176,"void opn2_setScaleModulators(OPN2_MIDIPlayer *, int)");
    }
    *(int *)((long)pvVar1 + 0x11bc) = smod;
    *(bool *)(*(long *)((long)pvVar1 + 400) + 0xd0) = smod != 0;
  }
  return;
}

Assistant:

OPNMIDI_EXPORT void opn2_setScaleModulators(OPN2_MIDIPlayer *device, int smod)
{
    if(!device)
        return;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->m_setup.ScaleModulators = smod;
    play->m_synth->m_scaleModulators = (play->m_setup.ScaleModulators != 0);
}